

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O0

double __thiscall ON_Line::MinimumDistanceTo(ON_Line *this,ON_Line *L)

{
  double dVar1;
  ON_3dPoint local_d8;
  ON_3dPoint local_c0;
  ON_3dPoint local_a8;
  ON_3dPoint local_90;
  undefined1 local_73;
  byte local_72;
  byte local_71;
  bool bGoodX;
  bool bCheckB;
  double dStack_70;
  bool bCheckA;
  double d;
  double x;
  double t;
  double b;
  double a;
  ON_3dPoint B;
  ON_3dPoint A;
  ON_Line *L_local;
  ON_Line *this_local;
  
  local_73 = ON_Intersect(this,L,&b,&t);
  local_71 = 1;
  if (0.0 <= b) {
    if (b <= 1.0) {
      local_71 = (local_73 ^ 0xff) & 1;
    }
    else {
      b = 1.0;
    }
  }
  else {
    b = 0.0;
  }
  local_72 = 1;
  if (0.0 <= t) {
    if (t <= 1.0) {
      local_72 = (local_73 ^ 0xff) & 1;
    }
    else {
      t = 1.0;
    }
  }
  else {
    t = 0.0;
  }
  PointAt(&local_90,this,b);
  B.z = local_90.x;
  PointAt(&local_a8,L,t);
  a = local_a8.x;
  B.x = local_a8.y;
  B.y = local_a8.z;
  dStack_70 = ON_3dPoint::DistanceTo((ON_3dPoint *)&B.z,(ON_3dPoint *)&a);
  if ((local_71 & 1) != 0) {
    ClosestPointTo(L,(ON_3dPoint *)&B.z,&x);
    if (0.0 <= x) {
      if (1.0 < x) {
        x = 1.0;
      }
    }
    else {
      x = 0.0;
    }
    PointAt(&local_c0,L,x);
    d = ON_3dPoint::DistanceTo(&local_c0,(ON_3dPoint *)&B.z);
    if (d < dStack_70) {
      dStack_70 = d;
    }
  }
  if ((local_72 & 1) != 0) {
    ClosestPointTo(this,(ON_3dPoint *)&a,&x);
    if (0.0 <= x) {
      if (1.0 < x) {
        x = 1.0;
      }
    }
    else {
      x = 0.0;
    }
    PointAt(&local_d8,this,x);
    dVar1 = ON_3dPoint::DistanceTo(&local_d8,(ON_3dPoint *)&a);
    if (dVar1 < dStack_70) {
      dStack_70 = dVar1;
    }
  }
  return dStack_70;
}

Assistant:

double ON_Line::MinimumDistanceTo( const ON_Line& L ) const
{
  ON_3dPoint A, B;
  double a, b, t, x, d;
  bool bCheckA, bCheckB;

  bool bGoodX = ON_Intersect(*this,L,&a,&b);

  bCheckA = true;
  if ( a < 0.0) a = 0.0; else if (a > 1.0) a = 1.0; else bCheckA=!bGoodX;
  bCheckB = true;
  if ( b < 0.0) b = 0.0; else if (b > 1.0) b = 1.0; else bCheckB=!bGoodX;

  A = PointAt(a);
  B = L.PointAt(b);
  d = A.DistanceTo(B);

  if ( bCheckA )
  {
    L.ClosestPointTo(A,&t);
    if (t<0.0) t = 0.0; else if (t > 1.0) t = 1.0;
    x = L.PointAt(t).DistanceTo(A);
    if ( x < d )
      d = x;
  }

  if ( bCheckB )
  {
    ClosestPointTo(B,&t);
    if (t<0.0) t = 0.0; else if (t > 1.0) t = 1.0;
    x = PointAt(t).DistanceTo(B);
    if (x < d )
      d = x;
  }
 
  return d;
}